

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O0

void __thiscall
test::prod_test::iu_PeepClassTest_x_iutest_x_PeepObject_Test::
iu_PeepClassTest_x_iutest_x_PeepObject_Test(iu_PeepClassTest_x_iutest_x_PeepObject_Test *this)

{
  iu_PeepClassTest_x_iutest_x_PeepObject_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_PeepClassTest_x_iutest_x_PeepObject_Test_00623708;
  return;
}

Assistant:

IUTEST(PeepClassTest, PeepObject)
{
    IUTEST_PEEP(ProdClass, m_x) prod_class_x(&s_prod);
    prod_class_x = 5;
    IUTEST_EXPECT_EQ(5, s_prod.GetX());
    prod_class_x += prod_class_x;
    IUTEST_EXPECT_EQ(10, s_prod.GetX());

    IUTEST_EXPECT_EQ(10, prod_class_x);
}